

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O2

int ProjectBissectionInParametricDomain<pzgeom::TPZEllipse3D>
              (TPZVec<double> *qsi,TPZVec<double> *qsiInDomain)

{
  bool bVar1;
  int iVar2;
  TPZVec<double> *this;
  int sideto;
  double dVar3;
  double dVar4;
  TPZVec<double> InnPt;
  TPZVec<double> OutPt;
  TPZManVector<double,_3> pt2;
  TPZManVector<double,_3> pt1;
  TPZTransform<double> T2;
  TPZTransform<double> T1;
  
  (*qsiInDomain->_vptr_TPZVec[3])(qsiInDomain,1);
  bVar1 = pztopology::TPZLine::IsInParametricDomain(qsi,0.0);
  if (bVar1) {
    iVar2 = 2;
    TPZVec<double>::operator=(qsiInDomain,qsi);
  }
  else {
    TPZVec<double>::TPZVec(&OutPt,qsi);
    TPZVec<double>::TPZVec(&InnPt,1);
    pztopology::TPZLine::CenterPoint(2,&InnPt);
    dVar3 = (*InnPt.fStore - *OutPt.fStore) * (*InnPt.fStore - *OutPt.fStore) + 0.0;
    if (dVar3 < 0.0) goto LAB_00edcf1b;
    dVar4 = SQRT(dVar3);
    while (1e-10 < dVar4) {
      *qsiInDomain->fStore = (*InnPt.fStore + *OutPt.fStore) * 0.5;
      bVar1 = pztopology::TPZLine::IsInParametricDomain(qsiInDomain,0.0);
      this = &OutPt;
      if (bVar1) {
        this = &InnPt;
      }
      TPZVec<double>::operator=(this,qsiInDomain);
      dVar3 = (*InnPt.fStore - *OutPt.fStore) * (*InnPt.fStore - *OutPt.fStore) + 0.0;
      dVar4 = SQRT(dVar3);
      if (dVar3 < 0.0) {
LAB_00edcf1b:
        dVar4 = sqrt(dVar3);
      }
    }
    TPZManVector<double,_3>::TPZManVector(&pt1,1);
    TPZManVector<double,_3>::TPZManVector(&pt2,1);
    sideto = 0;
    iVar2 = -1;
    do {
      if (sideto == 2) break;
      pztopology::TPZLine::SideToSideTransform(&T1,2,sideto);
      TPZTransform<double>::Apply(&T1,qsiInDomain,&pt1.super_TPZVec<double>);
      pztopology::TPZLine::SideToSideTransform(&T2,sideto,2);
      TPZTransform<double>::Apply(&T2,&pt1.super_TPZVec<double>,&pt2.super_TPZVec<double>);
      dVar3 = *qsiInDomain->fStore - *pt2.super_TPZVec<double>.fStore;
      dVar3 = dVar3 * dVar3 + 0.0;
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      if (dVar3 < 1e-10) {
        TPZVec<double>::operator=(qsiInDomain,&pt2.super_TPZVec<double>);
        iVar2 = sideto;
      }
      TPZTransform<double>::~TPZTransform(&T2);
      TPZTransform<double>::~TPZTransform(&T1);
      sideto = sideto + 1;
    } while (1e-10 <= dVar3);
    TPZManVector<double,_3>::~TPZManVector(&pt2);
    TPZManVector<double,_3>::~TPZManVector(&pt1);
    TPZVec<double>::~TPZVec(&InnPt);
    TPZVec<double>::~TPZVec(&OutPt);
  }
  return iVar2;
}

Assistant:

int ProjectBissectionInParametricDomain(TPZVec<REAL> &qsi, TPZVec<REAL> &qsiInDomain){
    const int nsides = Topology::NSides;
    const int dim = Topology::Dimension;
    
    qsiInDomain.Resize(dim);
    
    if(Topology::IsInParametricDomain(qsi,0.))///it is already in the domain
    {
        qsiInDomain = qsi;
        return nsides-1;
    }
    
    REAL tol = 1.e-10;
    
    ///first, will be made a project to center direction
    TPZVec<REAL> OutPt(qsi), InnPt(dim);
    Topology::CenterPoint(nsides-1,InnPt);
    
    REAL dist = 0.;
    for(int c = 0; c < dim; c++)
    {
        dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
    }
    dist = sqrt(dist);
    
    while(dist > tol)
    {
        for(int c = 0; c < dim; c++)
        {
            qsiInDomain[c] = (InnPt[c] + OutPt[c])/2.;
        }
        if(Topology::IsInParametricDomain(qsiInDomain,0.))
        {
            InnPt = qsiInDomain;
        }
        else
        {
            OutPt = qsiInDomain;
        }
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (InnPt[c] - OutPt[c])*(InnPt[c] - OutPt[c]);
        }
        dist = sqrt(dist);
    }
    
    ///found in witch side the projection belongs
    int winnerSide = -1;
    TPZManVector<REAL,3> pt1(dim), pt2(dim);
    for(int is = 0; is < nsides-1; is++)
    {
        ///Go orthogonally from \f$ NSides-1 \f$ to side is
        TPZTransform<> T1 = Topology::SideToSideTransform(nsides-1, is);
        T1.Apply(qsiInDomain,pt1);
        
        ///Come back from side is to \f$ NSides-1 \f$
        TPZTransform<> T2 = Topology::SideToSideTransform(is,nsides-1);
        T2.Apply(pt1,pt2);
        
        ///Compare ptInDomain to transformed point
        dist = 0.;
        for(int c = 0; c < dim; c++)
        {
            dist += (qsiInDomain[c]-pt2[c]) * (qsiInDomain[c]-pt2[c]);
        }//i
        dist = sqrt(dist);
        
        ///Closest side
        if(dist < tol)
        {
            winnerSide = is;
            qsiInDomain = pt2;
            break;
        }
    }//for is
    
    return winnerSide;
    
}